

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O0

AST_NodePtr chaiscript::ChaiScript::parse(string *t_input)

{
  undefined1 uVar1;
  undefined8 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ChaiScript_Parser *in_RDI;
  AST_NodePtr AVar3;
  ChaiScript_Parser parser;
  ChaiScript_Parser *in_stack_fffffffffffff280;
  undefined1 in_stack_fffffffffffff296;
  ChaiScript_Parser *this;
  undefined6 in_stack_fffffffffffff2b8;
  allocator in_stack_fffffffffffff2bf;
  eval_error *in_stack_fffffffffffff2c0;
  ChaiScript_Parser *in_stack_fffffffffffff2e0;
  allocator local_d09;
  string local_d08 [80];
  string *in_stack_fffffffffffff348;
  string *in_stack_fffffffffffff350;
  ChaiScript_Parser *in_stack_fffffffffffff358;
  
  this = in_RDI;
  chaiscript::parser::ChaiScript_Parser::ChaiScript_Parser(in_stack_fffffffffffff2e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d08,"PARSE",&local_d09);
  uVar1 = chaiscript::parser::ChaiScript_Parser::parse
                    (in_stack_fffffffffffff358,in_stack_fffffffffffff350,in_stack_fffffffffffff348);
  std::__cxx11::string::~string(local_d08);
  std::allocator<char>::~allocator((allocator<char> *)&local_d09);
  if ((uVar1 & 1) == 0) {
    uVar1 = 1;
    uVar2 = __cxa_allocate_exception(0x90);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffff2c0,"Unknown error while parsing",
               (allocator *)&stack0xfffffffffffff2bf);
    exception::eval_error::eval_error
              (in_stack_fffffffffffff2c0,
               (string *)
               CONCAT17(in_stack_fffffffffffff2bf,CONCAT16(uVar1,in_stack_fffffffffffff2b8)));
    __cxa_throw(uVar2,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
  }
  chaiscript::parser::ChaiScript_Parser::optimized_ast
            (this,(bool)uVar1,(bool)in_stack_fffffffffffff296);
  chaiscript::parser::ChaiScript_Parser::~ChaiScript_Parser(in_stack_fffffffffffff280);
  AVar3.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  AVar3.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (AST_NodePtr)AVar3.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static AST_NodePtr parse(const std::string &t_input)
    {
      parser::ChaiScript_Parser parser;
      if (parser.parse(t_input, "PARSE")) {
        //parser.show_match_stack();
        return parser.optimized_ast();
      } else {
        throw chaiscript::exception::eval_error("Unknown error while parsing");
      }
    }